

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertable_log.c
# Opt level: O0

int mpt_convertable_vlog(mpt_convertable *dest,char *src,int type,char *fmt,__va_list_tag *va)

{
  int iVar1;
  mpt_logger *local_48;
  mpt_logger *log;
  mpt_output *out;
  __va_list_tag *va_local;
  char *fmt_local;
  char *pcStack_20;
  int type_local;
  char *src_local;
  mpt_convertable *dest_local;
  
  out = (mpt_output *)va;
  va_local = (__va_list_tag *)fmt;
  fmt_local._4_4_ = type;
  pcStack_20 = src;
  src_local = (char *)dest;
  if (dest == (mpt_convertable *)0x0) {
    local_48 = mpt_log_default();
    if (local_48 == (mpt_logger *)0x0) {
      dest_local._4_4_ = 0;
    }
    else {
      dest_local._4_4_ =
           (*local_48->_vptr->log)
                     (local_48,pcStack_20,fmt_local._4_4_,(char *)va_local,(__va_list_tag *)out);
    }
  }
  else {
    local_48 = (mpt_logger *)0x0;
    iVar1 = (*dest->_vptr->convert)(dest,0x81,&local_48);
    if (iVar1 < 1) {
      log = (mpt_logger *)0x0;
      iVar1 = (*(code *)**(undefined8 **)src_local)(src_local,0x83,&log);
      if (iVar1 < 1) {
        dest_local._4_4_ = -3;
      }
      else if (log == (mpt_logger *)0x0) {
        dest_local._4_4_ = 0;
      }
      else {
        dest_local._4_4_ =
             mpt_output_vlog((mpt_output *)log,pcStack_20,fmt_local._4_4_,(char *)va_local,
                             (__va_list_tag *)out);
      }
    }
    else if (local_48 == (mpt_logger *)0x0) {
      dest_local._4_4_ = 0;
    }
    else {
      dest_local._4_4_ =
           (*local_48->_vptr->log)
                     (local_48,pcStack_20,fmt_local._4_4_,(char *)va_local,(__va_list_tag *)out);
    }
  }
  return dest_local._4_4_;
}

Assistant:

__MPT_NAMESPACE_BEGIN

/*!
 * \ingroup mptOutput
 * \brief log to convertable
 * 
 * Use convertable as target for log message.
 * 
 * \param dest metatype instance
 * \param src  originating location
 * \param type message type and flags
 * \param fmt  log arguments format string
 * \param va   argument list
 * 
 * \return lor operation result
 */
int mpt_convertable_vlog(MPT_INTERFACE(convertable) *dest, const char *src, int type, const char *fmt, va_list va)
{
	MPT_INTERFACE(output) *out;
	MPT_INTERFACE(logger) *log;
	
	if (!dest) {
		if (!(log  = mpt_log_default())) {
			return 0;
		}
		return log->_vptr->log(log, src, type, fmt, va);
	}
	log = 0;
	if (dest->_vptr->convert(dest, MPT_ENUM(TypeLoggerPtr), &log) > 0) {
		if (!log) {
			return 0;
		}
		return log->_vptr->log(log, src, type, fmt, va);
	}
	out = 0;
	if (dest->_vptr->convert(dest, MPT_ENUM(TypeOutputPtr), &out) > 0) {
		if (!out) {
			return 0;
		}
		return mpt_output_vlog(out, src, type, fmt, va);
	}
	return MPT_ERROR(BadType);
}